

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

wchar_t fmt::v7::detail::decimal_point_impl<wchar_t>(locale_ref loc)

{
  wchar_t wVar1;
  locale local_18 [8];
  void *local_10;
  locale_ref loc_local;
  
  local_10 = loc.locale_;
  locale_ref::get<std::locale>((locale_ref *)local_18);
  std::use_facet<std::__cxx11::numpunct<wchar_t>>(local_18);
  wVar1 = std::__cxx11::numpunct<wchar_t>::decimal_point();
  std::locale::~locale(local_18);
  return wVar1;
}

Assistant:

FMT_FUNC Char decimal_point_impl(locale_ref loc) {
  return std::use_facet<std::numpunct<Char>>(loc.get<std::locale>())
      .decimal_point();
}